

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O0

int main(void)

{
  nn_trie local_18;
  nn_trie trie;
  int rc;
  
  trie.root._4_4_ = 0;
  nn_trie_init(&local_18);
  trie.root._0_4_ = nn_trie_match(&local_18,"",0);
  if ((int)trie.root != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x25);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_match(&local_18,(uint8_t *)"ABC",3);
  if ((int)trie.root != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x27);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_trie_term(&local_18);
  nn_trie_init(&local_18);
  trie.root._0_4_ = nn_trie_subscribe(&local_18,"",0);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x2d);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_match(&local_18,"",0);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x2f);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_match(&local_18,(uint8_t *)"ABC",3);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x31);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_trie_term(&local_18);
  nn_trie_init(&local_18);
  trie.root._0_4_ = nn_trie_subscribe(&local_18,(uint8_t *)"ABC",3);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x37);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_match(&local_18,"DEF",3);
  if ((int)trie.root != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x39);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_match(&local_18,(uint8_t *)"AB",2);
  if ((int)trie.root != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x3b);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_match(&local_18,(uint8_t *)"ABC",3);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x3d);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_match(&local_18,(uint8_t *)"ABCDE",5);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x3f);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_trie_term(&local_18);
  nn_trie_init(&local_18);
  trie.root._0_4_ =
       nn_trie_subscribe(&local_18,(uint8_t *)"01234567890123456789012345678901234",0x23);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x46);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_match(&local_18,"",0);
  if ((int)trie.root != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x48);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_match(&local_18,(uint8_t *)"012456789",10);
  if ((int)trie.root != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x4a);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_match(&local_18,(uint8_t *)"012345678901234567",0x12);
  if ((int)trie.root != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x4c);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_match(&local_18,(uint8_t *)"01234567890123456789012345678901234",0x23);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x4f);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_trie_term(&local_18);
  nn_trie_init(&local_18);
  trie.root._0_4_ = nn_trie_subscribe(&local_18,(uint8_t *)"ABC",3);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x55);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_subscribe(&local_18,(uint8_t *)"ADE",3);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x57);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_match(&local_18,(uint8_t *)"A",1);
  if ((int)trie.root != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x59);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_match(&local_18,(uint8_t *)"AD",2);
  if ((int)trie.root != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x5b);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_trie_term(&local_18);
  nn_trie_init(&local_18);
  trie.root._0_4_ = nn_trie_subscribe(&local_18,(uint8_t *)"A",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x61);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_subscribe(&local_18,"B",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            99);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_subscribe(&local_18,"C",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x65);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_subscribe(&local_18,"0",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x67);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_subscribe(&local_18,"E",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x69);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_subscribe(&local_18,"F",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x6b);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_subscribe(&local_18,"1",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x6d);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_subscribe(&local_18,(uint8_t *)"@",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x6f);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_subscribe(&local_18,(uint8_t *)"b",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x71);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_subscribe(&local_18,"f",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x73);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_match(&local_18,"0",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x75);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_match(&local_18,(uint8_t *)"A",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x77);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_match(&local_18,"f",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x79);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_match(&local_18,(uint8_t *)"000",3);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x7b);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_match(&local_18,(uint8_t *)"a",1);
  if ((int)trie.root != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x7d);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_match(&local_18,"c",1);
  if ((int)trie.root != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x7f);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_trie_term(&local_18);
  nn_trie_init(&local_18);
  trie.root._0_4_ = nn_trie_subscribe(&local_18,(uint8_t *)"ABCD",4);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x85);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_subscribe(&local_18,(uint8_t *)"AB",2);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x87);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_unsubscribe(&local_18,(uint8_t *)"AB",2);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x89);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_match(&local_18,(uint8_t *)"AB",2);
  if ((int)trie.root != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x8b);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_match(&local_18,(uint8_t *)"ABCDEF",6);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x8d);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_subscribe(&local_18,(uint8_t *)"ABEF",4);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x8f);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_unsubscribe(&local_18,(uint8_t *)"ABCD",4);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x91);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_match(&local_18,(uint8_t *)"ABCD",4);
  if ((int)trie.root != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x93);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_match(&local_18,(uint8_t *)"ABEF",4);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x95);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_trie_term(&local_18);
  nn_trie_init(&local_18);
  trie.root._0_4_ = nn_trie_subscribe(&local_18,(uint8_t *)"A",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x9b);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_unsubscribe(&local_18,(uint8_t *)"A",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x9d);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_match(&local_18,"",0);
  if ((int)trie.root != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0x9f);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_match(&local_18,(uint8_t *)"A",1);
  if ((int)trie.root != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0xa1);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_trie_term(&local_18);
  nn_trie_init(&local_18);
  trie.root._0_4_ = nn_trie_subscribe(&local_18,(uint8_t *)"A",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0xa7);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_subscribe(&local_18,"B",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0xa9);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_subscribe(&local_18,"C",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0xab);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_subscribe(&local_18,"0",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0xad);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_subscribe(&local_18,"E",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0xaf);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_subscribe(&local_18,"F",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0xb1);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_subscribe(&local_18,"1",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0xb3);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_subscribe(&local_18,(uint8_t *)"@",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0xb5);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_subscribe(&local_18,(uint8_t *)"b",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0xb7);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_subscribe(&local_18,"f",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0xb9);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_unsubscribe(&local_18,"0",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0xbb);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_unsubscribe(&local_18,"f",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0xbd);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_unsubscribe(&local_18,"E",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0xbf);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_unsubscribe(&local_18,"B",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0xc1);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_unsubscribe(&local_18,(uint8_t *)"A",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0xc3);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_unsubscribe(&local_18,"1",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0xc5);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_unsubscribe(&local_18,(uint8_t *)"@",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            199);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_unsubscribe(&local_18,"F",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0xc9);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_unsubscribe(&local_18,"C",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0xcb);
    fflush(_stderr);
    nn_err_abort();
  }
  trie.root._0_4_ = nn_trie_unsubscribe(&local_18,(uint8_t *)"b",1);
  if ((int)trie.root != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/trie.c",
            0xcd);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_trie_term(&local_18);
  return 0;
}

Assistant:

int main ()
{
    int rc;
    struct nn_trie trie;

    /*  Try matching with an empty trie. */
    nn_trie_init (&trie);
    rc = nn_trie_match (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 0);
    nn_trie_term (&trie);

    /*  Try matching with "all" subscription. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    /*  Try some simple matching. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "DEF", 3);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "AB", 2);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABCDE", 5);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    /*  Try a long subcsription. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie,
        (const uint8_t*) "01234567890123456789012345678901234", 35);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "012456789", 10);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "012345678901234567", 18);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie,
        (const uint8_t*) "01234567890123456789012345678901234", 35);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    /*  Try matching with a sparse node involved. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ADE", 3);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "AD", 2);
    nn_assert (rc == 0);
    nn_trie_term (&trie);

    /*  Try matching with a dense node involved. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "B", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "C", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "0", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "E", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "F", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "1", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "@", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "b", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "f", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "0", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "f", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "000", 3);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "a", 1);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "c", 1);
    nn_assert (rc == 0);
    nn_trie_term (&trie);

    /*  Check prefix splitting and compaction. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ABCD", 4);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "AB", 2);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "AB", 2);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "AB", 2);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABCDEF", 6);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ABEF", 4);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "ABCD", 4);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABCD", 4);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABEF", 4);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    /*  Check whether there's no problem with removing all subscriptions. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 0);
    nn_trie_term (&trie);  

    /*  Check converting from sparse node to dense node and vice versa. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "B", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "C", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "0", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "E", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "F", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "1", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "@", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "b", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "f", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "0", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "f", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "E", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "B", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "1", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "@", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "F", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "C", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "b", 1);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    return 0;
}